

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_table_calculation.cpp
# Opt level: O3

void __thiscall
ParseTableCalculation::closeItemSet
          (ParseTableCalculation *this,
          set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
          *set)

{
  _Rb_tree_header *__last;
  pointer pvVar1;
  Item *pIVar2;
  int iVar3;
  int iVar4;
  iterator iVar5;
  iterator iVar6;
  _Rb_tree_node_base *p_Var7;
  int *piVar8;
  pointer item_00;
  _Alloc_hider _Var9;
  string right_of_dot;
  vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_> items;
  Item item;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  first_set;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  after_non_terminal_tokens;
  vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_> local_118;
  Item *local_f8;
  Item *local_f0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_e8;
  int *local_e0;
  string local_d8;
  vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_> local_b8;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  char local_88 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  __last = &(set->_M_t)._M_impl.super__Rb_tree_header;
  std::vector<ParseTableCalculation::Item,std::allocator<ParseTableCalculation::Item>>::
  vector<std::_Rb_tree_const_iterator<ParseTableCalculation::Item>,void>
            ((vector<ParseTableCalculation::Item,std::allocator<ParseTableCalculation::Item>> *)
             &local_b8,(set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<ParseTableCalculation::Item>)__last,
             (allocator_type *)&local_78);
  local_118.
  super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8 = local_b8.
             super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_b8.
      super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_e8 = &(this->non_terminal_to_rule_indices_)._M_h;
    item_00 = local_b8.
              super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      do {
        rightOfDot_abi_cxx11_(&local_d8,this,item_00);
        _Var9._M_p = local_d8._M_dataplus._M_p;
        local_f0 = item_00;
        if ((local_d8._M_string_length != 0) &&
           (iVar3 = isupper((int)*local_d8._M_dataplus._M_p), iVar3 == 0)) {
          iVar5 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(local_e8,&local_d8);
          pIVar2 = local_f0;
          if (iVar5.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            __assert_fail("found != non_terminal_to_rule_indices_.end()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/matej-svejda[P]script2000/src/parse_table_calculation.cpp"
                          ,0x52,"void ParseTableCalculation::closeItemSet(std::set<Item> &)");
          }
          pvVar1 = (this->rules_).
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)local_f0->dotPosition * 0x20 +
                      *(long *)&pvVar1[local_f0->ruleIndex].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data + 0x20),
                     *(pointer *)
                      ((long)&pvVar1[local_f0->ruleIndex].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 8),(allocator_type *)&local_78);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_48,&pIVar2->lookahead);
          getFirstSet((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_78,this,&local_48);
          piVar8 = *(int **)((long)iVar5.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_true>
                                   ._M_cur + 0x28);
          local_e0 = *(int **)((long)iVar5.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_true>
                                     ._M_cur + 0x30);
          if (piVar8 != local_e0) {
            do {
              iVar3 = *piVar8;
              iVar4 = (int)((ulong)((long)(this->rules_).
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->rules_).
                                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3);
              p_Var7 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
              if (SBORROW4(iVar3,iVar4 * -0x55555555) == iVar3 + iVar4 * 0x55555555 < 0) {
                __assert_fail("rule_index < static_cast<int>(rules_.size())",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/matej-svejda[P]script2000/src/parse_table_calculation.cpp"
                              ,0x59,"void ParseTableCalculation::closeItemSet(std::set<Item> &)");
              }
              for (; (_Rb_tree_header *)p_Var7 != &local_78._M_impl.super__Rb_tree_header;
                  p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
                local_a0._4_4_ = 1;
                local_a0._0_4_ = iVar3;
                local_98._M_p = local_88;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_98,*(long *)(p_Var7 + 1),
                           (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
                iVar6 = std::
                        _Rb_tree<ParseTableCalculation::Item,_ParseTableCalculation::Item,_std::_Identity<ParseTableCalculation::Item>,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
                        ::find(&set->_M_t,(key_type *)local_a0);
                if ((_Rb_tree_header *)iVar6._M_node == __last) {
                  std::
                  _Rb_tree<ParseTableCalculation::Item,ParseTableCalculation::Item,std::_Identity<ParseTableCalculation::Item>,std::less<ParseTableCalculation::Item>,std::allocator<ParseTableCalculation::Item>>
                  ::_M_insert_unique<ParseTableCalculation::Item_const&>
                            ((_Rb_tree<ParseTableCalculation::Item,ParseTableCalculation::Item,std::_Identity<ParseTableCalculation::Item>,std::less<ParseTableCalculation::Item>,std::allocator<ParseTableCalculation::Item>>
                              *)set,(key_type *)local_a0);
                  std::
                  vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
                  ::push_back(&local_118,(key_type *)local_a0);
                }
                if (local_98._M_p != local_88) {
                  operator_delete(local_98._M_p);
                }
              }
              piVar8 = piVar8 + 1;
            } while (piVar8 != local_e0);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_78);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          _Var9._M_p = local_d8._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_d8.field_2) {
          operator_delete(_Var9._M_p);
        }
        item_00 = local_f0 + 1;
      } while (local_f0 + 1 != local_f8);
      if (local_118.
          super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_118.
          super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
          ._M_impl.super__Vector_impl_data._M_finish) break;
      std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>::
      operator=(&local_b8,&local_118);
      std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>::
      ~vector(&local_118);
      local_118.
      super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.
      super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118.
      super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f8 = local_b8.
                 super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      item_00 = local_b8.
                super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (local_b8.
             super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_b8.
             super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>::~vector
            (&local_118);
  std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>::~vector
            (&local_b8);
  return;
}

Assistant:

void ParseTableCalculation::closeItemSet(std::set<Item>& set)
{
	std::vector<Item> items(set.begin(), set.end());
	for (;;)
	{
		std::vector<Item> added_items;
		for (const Item& item : items)
		{
			std::string right_of_dot = rightOfDot(item);
			if (right_of_dot.empty() || isTerminal(right_of_dot))
			{
				continue;
			}
			auto found = non_terminal_to_rule_indices_.find(right_of_dot);
			assert(found != non_terminal_to_rule_indices_.end());
			const auto& rule = rules_[item.ruleIndex];
			std::vector<std::string> after_non_terminal_tokens(rule.begin() + item.dotPosition + 1, rule.end());
			after_non_terminal_tokens.push_back(item.lookahead);
			auto first_set = getFirstSet(after_non_terminal_tokens);
			for (int rule_index : found->second)
			{
				assert(rule_index < static_cast<int>(rules_.size()));
				for (const auto& token : first_set)
				{
					Item item(rule_index, 1, token);
					if (set.find(item) == set.end())
					{
						set.insert(item);
						added_items.push_back(item);
					}
				}
			}
		}
		if (added_items.empty())
		{
			return;
		}
		items = added_items;
	}
}